

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O2

char * parse_headers(char *buf,char *buf_end,phr_header *headers,size_t *num_headers,
                    size_t max_headers,int *ret)

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  size_t value_len;
  char *value;
  size_t local_40;
  char *local_38;
  
  do {
    if (buf == buf_end) {
LAB_00106a32:
      *ret = -2;
      return (char *)0x0;
    }
    cVar1 = *buf;
    if (cVar1 == '\n') {
      return buf + 1;
    }
    if (cVar1 == '\r') {
      if (buf + 1 != buf_end) {
        if (buf[1] == '\n') {
          return buf + 2;
        }
LAB_00106a3b:
        *ret = -1;
        return (char *)0x0;
      }
      goto LAB_00106a32;
    }
    sVar4 = *num_headers;
    if (sVar4 == max_headers) goto LAB_00106a3b;
    if ((sVar4 == 0) || ((cVar1 != '\t' && (cVar1 != ' ')))) {
      headers[sVar4].name = buf;
      sVar3 = 0;
      pcVar5 = buf;
      while( true ) {
        pcVar5 = pcVar5 + 1;
        if ((ulong)(byte)buf[sVar3] == 0x3a) break;
        if (""[(byte)buf[sVar3]] == '\0') goto LAB_00106a3b;
        lVar2 = sVar3 + 1;
        sVar3 = sVar3 + 1;
        if (buf + lVar2 == buf_end) goto LAB_00106a32;
      }
      headers[sVar4].name_len = sVar3;
      buf = pcVar5;
      if (sVar3 == 0) goto LAB_00106a3b;
      while( true ) {
        if (buf == buf_end) goto LAB_00106a32;
        if ((*buf != ' ') && (*buf != '\t')) break;
        buf = buf + 1;
      }
    }
    else {
      headers[sVar4].name = (char *)0x0;
      headers[sVar4].name_len = 0;
    }
    buf = get_token_to_eol(buf,buf_end,&local_38,&local_40,ret);
    sVar4 = local_40;
    if (buf == (char *)0x0) {
      return (char *)0x0;
    }
    for (; pcVar5 = local_38, sVar4 != 0; sVar4 = sVar4 - 1) {
      if ((local_38[sVar4 - 1] != ' ') && (local_38[sVar4 - 1] != '\t')) {
        pcVar5 = local_38 + sVar4;
        break;
      }
    }
    sVar4 = *num_headers;
    headers[sVar4].value = local_38;
    headers[sVar4].value_len = (long)pcVar5 - (long)local_38;
    *num_headers = *num_headers + 1;
  } while( true );
}

Assistant:

static const char *parse_headers(const char *buf, const char *buf_end, struct phr_header *headers, size_t *num_headers,
                                 size_t max_headers, int *ret)
{
    for (;; ++*num_headers) {
        CHECK_EOF();
        if (*buf == '\015') {
            ++buf;
            EXPECT_CHAR('\012');
            break;
        } else if (*buf == '\012') {
            ++buf;
            break;
        }
        if (*num_headers == max_headers) {
            *ret = -1;
            return NULL;
        }
        if (!(*num_headers != 0 && (*buf == ' ' || *buf == '\t'))) {
            /* parsing name, but do not discard SP before colon, see
             * http://www.mozilla.org/security/announce/2006/mfsa2006-33.html */
            headers[*num_headers].name = buf;
            static const char ALIGNED(16) ranges1[] = "\x00 "  /* control chars and up to SP */
                                                      "\"\""   /* 0x22 */
                                                      "()"     /* 0x28,0x29 */
                                                      ",,"     /* 0x2c */
                                                      "//"     /* 0x2f */
                                                      ":@"     /* 0x3a-0x40 */
                                                      "[]"     /* 0x5b-0x5d */
                                                      "{\377"; /* 0x7b-0xff */
            int found;
            buf = findchar_fast(buf, buf_end, ranges1, sizeof(ranges1) - 1, &found);
            if (!found) {
                CHECK_EOF();
            }
            while (1) {
                if (*buf == ':') {
                    break;
                } else if (!token_char_map[(unsigned char)*buf]) {
                    *ret = -1;
                    return NULL;
                }
                ++buf;
                CHECK_EOF();
            }
            if ((headers[*num_headers].name_len = buf - headers[*num_headers].name) == 0) {
                *ret = -1;
                return NULL;
            }
            ++buf;
            for (;; ++buf) {
                CHECK_EOF();
                if (!(*buf == ' ' || *buf == '\t')) {
                    break;
                }
            }
        } else {
            headers[*num_headers].name = NULL;
            headers[*num_headers].name_len = 0;
        }
        const char *value;
        size_t value_len;
        if ((buf = get_token_to_eol(buf, buf_end, &value, &value_len, ret)) == NULL) {
            return NULL;
        }
        /* remove trailing SPs and HTABs */
        const char *value_end = value + value_len;
        for (; value_end != value; --value_end) {
            const char c = *(value_end - 1);
            if (!(c == ' ' || c == '\t')) {
                break;
            }
        }
        headers[*num_headers].value = value;
        headers[*num_headers].value_len = value_end - value;
    }
    return buf;
}